

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetColumnSortDirection
               (int column_n,ImGuiSortDirection sort_direction,bool append_to_sort_specs)

{
  ImGuiTable *pIVar1;
  ImGuiTableColumn *pIVar2;
  ImGuiTable *this;
  ImGuiTable *table_00;
  byte in_DL;
  int in_ESI;
  ImGuiTableColumn *other_column;
  int other_column_n_1;
  ImGuiTableColumn *column;
  int other_column_n;
  ImGuiTableColumnIdx sort_order_max;
  ImGuiTable *table;
  ImGuiContext *g;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffcc;
  int i;
  ImSpan<ImGuiTableColumn> *in_stack_ffffffffffffffd0;
  int local_28;
  char local_21;
  byte local_9;
  
  local_9 = in_DL & 1;
  pIVar1 = GImGui->CurrentTable;
  if ((pIVar1->Flags & 0x4000000U) == 0) {
    local_9 = 0;
  }
  if (((pIVar1->Flags & 0x8000000U) == 0) && (in_ESI == 0)) {
    __assert_fail("sort_direction != ImGuiSortDirection_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xa16,"void ImGui::TableSetColumnSortDirection(int, ImGuiSortDirection, bool)");
  }
  local_21 = '\0';
  if (local_9 != 0) {
    for (local_28 = 0; local_28 < pIVar1->ColumnsCount; local_28 = local_28 + 1) {
      in_stack_ffffffffffffffbc = CONCAT13(local_21,(int3)in_stack_ffffffffffffffbc);
      pIVar2 = ImSpan<ImGuiTableColumn>::operator[]
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      local_21 = ImMax<signed_char>((char)((uint)in_stack_ffffffffffffffbc >> 0x18),
                                    pIVar2->SortOrder);
    }
  }
  this = (ImGuiTable *)
         ImSpan<ImGuiTableColumn>::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  *(byte *)&this->SettingsOffset = (byte)this->SettingsOffset & 0xfc | (byte)in_ESI & 3;
  if ((this->SettingsOffset & 3) == 0) {
    *(ImGuiTableColumnIdx *)((long)&this->VisibleMaskByIndex + 6) = -1;
  }
  else if ((*(ImGuiTableColumnIdx *)((long)&this->VisibleMaskByIndex + 6) == -1) || (local_9 == 0))
  {
    if (local_9 == 0) {
      in_stack_ffffffffffffffb8 = 0;
    }
    else {
      in_stack_ffffffffffffffb8 = local_21 + 1;
    }
    *(ImGuiTableColumnIdx *)((long)&this->VisibleMaskByIndex + 6) =
         (ImGuiTableColumnIdx)in_stack_ffffffffffffffb8;
  }
  for (i = 0; i < pIVar1->ColumnsCount; i = i + 1) {
    table_00 = (ImGuiTable *)
               ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)this,i);
    if ((table_00 != this) && (local_9 == 0)) {
      *(undefined1 *)((long)&table_00->VisibleMaskByIndex + 6) = 0xff;
    }
    TableFixColumnSortDirection
              (table_00,(ImGuiTableColumn *)
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  pIVar1->IsSettingsDirty = true;
  pIVar1->IsSortSpecsDirty = true;
  return;
}

Assistant:

void ImGui::TableSetColumnSortDirection(int column_n, ImGuiSortDirection sort_direction, bool append_to_sort_specs)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;

    if (!(table->Flags & ImGuiTableFlags_SortMulti))
        append_to_sort_specs = false;
    if (!(table->Flags & ImGuiTableFlags_SortTristate))
        IM_ASSERT(sort_direction != ImGuiSortDirection_None);

    ImGuiTableColumnIdx sort_order_max = 0;
    if (append_to_sort_specs)
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
            sort_order_max = ImMax(sort_order_max, table->Columns[other_column_n].SortOrder);

    ImGuiTableColumn* column = &table->Columns[column_n];
    column->SortDirection = (ImU8)sort_direction;
    if (column->SortDirection == ImGuiSortDirection_None)
        column->SortOrder = -1;
    else if (column->SortOrder == -1 || !append_to_sort_specs)
        column->SortOrder = append_to_sort_specs ? sort_order_max + 1 : 0;

    for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
    {
        ImGuiTableColumn* other_column = &table->Columns[other_column_n];
        if (other_column != column && !append_to_sort_specs)
            other_column->SortOrder = -1;
        TableFixColumnSortDirection(table, other_column);
    }
    table->IsSettingsDirty = true;
    table->IsSortSpecsDirty = true;
}